

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O2

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,function<void_(const_QFutureInterfaceBase_&)> func)

{
  long lVar1;
  AtomicType AVar2;
  AtomicType AVar3;
  function<void_(const_QFutureInterfaceBase_&)> func_00;
  AtomicType *in_RSI;
  long in_FS_OFFSET;
  undefined8 uVar4;
  undefined8 uVar5;
  AtomicType AVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (__base_type)0x0;
  uVar5 = (AtomicType)0x0;
  AVar2._M_b._M_p = in_RSI[3]._M_b;
  AVar3._M_b._M_p = in_RSI[2]._M_b;
  AVar6._M_b._M_p = (__base_type)(__base_type)(__pointer_type)0x0;
  if (AVar3._M_b._M_p != (__pointer_type)0x0) {
    uVar4 = in_RSI->_M_b;
    uVar5 = in_RSI[1]._M_b;
    in_RSI[2]._M_b = (__base_type)0x0;
    in_RSI[3]._M_b = (__base_type)0x0;
    AVar6._M_b._M_p = AVar3._M_b._M_p;
  }
  func_00.super__Function_base._M_functor._8_8_ = uVar5;
  func_00.super__Function_base._M_functor._M_unused._M_object = (void *)uVar4;
  func_00.super__Function_base._M_manager = (_Manager_type)AVar6._M_b._M_p;
  func_00._M_invoker = (_Invoker_type)AVar2._M_b._M_p;
  setContinuation(this,func_00,(QFutureInterfaceBasePrivate *)&stack0xffffffffffffffc8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setContinuation(std::function<void(const QFutureInterfaceBase &)> func)
{
    setContinuation(std::move(func), nullptr);
}